

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyMemory.cpp
# Opt level: O1

void Js::WebAssemblyMemory::CheckLimits(ScriptContext *scriptContext,uint32 initial,uint32 maximum)

{
  char16_t *varName;
  
  if (maximum < initial) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ebf6,(PCWSTR)0x0);
  }
  if (initial < 0x8000 || DAT_015aa2e2 != '\0') {
    if (maximum < 0x10001 || DAT_015aa2e2 != '\0') {
      return;
    }
    varName = L"descriptor.maximum";
  }
  else {
    varName = L"descriptor.initial";
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec37,varName);
}

Assistant:

void WebAssemblyMemory::CheckLimits(ScriptContext * scriptContext, uint32 initial, uint32 maximum)
{
    if (maximum < initial)
    {
        JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
    }
    if (initial > Wasm::Limits::GetMaxMemoryInitialPages())
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_Invalid, _u("descriptor.initial"));
    }
    if (maximum > Wasm::Limits::GetMaxMemoryMaximumPages())
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_Invalid, _u("descriptor.maximum"));
    }
}